

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapinfo.cpp
# Opt level: O3

vector<PBombInfo,_std::allocator<PBombInfo>_> * __thiscall
MapInfo::getBombs(vector<PBombInfo,_std::allocator<PBombInfo>_> *__return_storage_ptr__,
                 MapInfo *this)

{
  pointer *ppPVar1;
  _List_node_base *p_Var2;
  iterator __position;
  PBombInfo local_38;
  
  (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->bombs).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->bombs;
      p_Var2 = p_Var2->_M_next) {
    local_38.pos = (Vec2)p_Var2[1]._M_prev;
    local_38.velocity = (Vec2)p_Var2[2]._M_next;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<PBombInfo,std::allocator<PBombInfo>>::_M_realloc_insert<PBombInfo_const&>
                ((vector<PBombInfo,std::allocator<PBombInfo>> *)__return_storage_ptr__,__position,
                 &local_38);
    }
    else {
      (__position._M_current)->pos = local_38.pos;
      (__position._M_current)->velocity = local_38.velocity;
      ppPVar1 = &(__return_storage_ptr__->super__Vector_base<PBombInfo,_std::allocator<PBombInfo>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PBombInfo> MapInfo::getBombs()
{
    vector<PBombInfo> res;
    for (auto it = bombs.begin(); it != bombs.end(); ++it)
    {
        PBombInfo p;
        p.pos = it->pos;
        p.velocity = it->velocity;
        res.push_back(p);
    }
    return res;
}